

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O1

void __thiscall ProfileData::Add(ProfileData *this,int depth,void **stack)

{
  ulong uVar1;
  long lVar2;
  Entry *pEVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  Entry *e;
  Entry *pEVar11;
  uint uVar12;
  bool bVar13;
  
  if (-1 < this->out_) {
    uVar12 = 0xfe;
    if (depth < 0xfe) {
      uVar12 = depth;
    }
    if (depth < 1) {
      syscall(1,2,"Check failed: depth > 0: ProfileData::Add depth <= 0\n",0x35);
      abort();
    }
    uVar10 = (ulong)uVar12;
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = (long)stack[uVar5] * 0x29 + (uVar6 << 8 | uVar6 >> 0x38);
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
    this->count_ = this->count_ + 1;
    uVar6 = (ulong)(((uint)uVar6 & 0x3ff) << 0xd);
    pEVar3 = (Entry *)((long)this->hash_->entry[0].stack + (uVar6 - 0x10));
    uVar5 = 1;
    if (1 < (int)uVar12) {
      uVar5 = (ulong)uVar12;
    }
    lVar7 = (long)this->hash_->entry[0].stack + uVar6 + 8;
    lVar8 = 0;
    bVar9 = false;
    do {
      bVar13 = true;
      if ((pEVar3[lVar8].depth == uVar10) &&
         (pEVar11 = pEVar3 + lVar8, (void *)pEVar11->stack[0] == *stack)) {
        uVar6 = 0;
        do {
          if (uVar5 - 1 == uVar6) {
            bVar13 = uVar6 + 1 < uVar10;
            pEVar11->count = pEVar11->count + 1;
            bVar9 = true;
            goto LAB_0010f9d5;
          }
          lVar2 = uVar6 * 8;
          uVar1 = uVar6 + 1;
          lVar4 = uVar6 + 1;
          uVar6 = uVar1;
        } while (*(void **)(lVar7 + lVar2) == stack[lVar4]);
        bVar13 = uVar1 < uVar10;
      }
LAB_0010f9d5:
      if (!bVar13) break;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x800;
    } while (lVar8 != 4);
    if (!bVar9) {
      lVar7 = 0x800;
      pEVar11 = pEVar3;
      do {
        if (*(ulong *)((long)pEVar3->stack + lVar7 + -0x10) < pEVar11->count) {
          pEVar11 = (Entry *)((long)pEVar3->stack + lVar7 + -0x10);
        }
        lVar7 = lVar7 + 0x800;
      } while (lVar7 != 0x2000);
      if (pEVar11->count != 0) {
        this->evictions_ = this->evictions_ + 1;
        Evict(this,pEVar11);
      }
      pEVar11->depth = uVar10;
      pEVar11->count = 1;
      uVar5 = 1;
      if (1 < (int)uVar12) {
        uVar5 = (ulong)uVar12;
      }
      uVar6 = 0;
      do {
        pEVar11->stack[uVar6] = (Slot)stack[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  return;
}

Assistant:

void ProfileData::Add(int depth, const void* const* stack) {
  if (!enabled()) {
    return;
  }

  if (depth > kMaxStackDepth) depth = kMaxStackDepth;
  RAW_CHECK(depth > 0, "ProfileData::Add depth <= 0");

  // Make hash-value
  Slot h = 0;
  for (int i = 0; i < depth; i++) {
    Slot slot = reinterpret_cast<Slot>(stack[i]);
    h = (h << 8) | (h >> (8*(sizeof(h)-1)));
    h += (slot * 31) + (slot * 7) + (slot * 3);
  }

  count_++;

  // See if table already has an entry for this trace
  bool done = false;
  Bucket* bucket = &hash_[h % kBuckets];
  for (int a = 0; a < kAssociativity; a++) {
    Entry* e = &bucket->entry[a];
    if (e->depth == depth) {
      bool match = true;
      for (int i = 0; i < depth; i++) {
        if (e->stack[i] != reinterpret_cast<Slot>(stack[i])) {
          match = false;
          break;
        }
      }
      if (match) {
        e->count++;
        done = true;
        break;
      }
    }
  }

  if (!done) {
    // Evict entry with smallest count
    Entry* e = &bucket->entry[0];
    for (int a = 1; a < kAssociativity; a++) {
      if (bucket->entry[a].count < e->count) {
        e = &bucket->entry[a];
      }
    }
    if (e->count > 0) {
      evictions_++;
      Evict(*e);
    }

    // Use the newly evicted entry
    e->depth = depth;
    e->count = 1;
    for (int i = 0; i < depth; i++) {
      e->stack[i] = reinterpret_cast<Slot>(stack[i]);
    }
  }
}